

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

void __thiscall
duckdb::Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<duckdb::LogicalType,_true> *ret)

{
  int iVar1;
  undefined4 extraout_var;
  undefined6 in_register_00000032;
  long lVar2;
  LogicalType val;
  pointer local_68;
  pointer pLStack_60;
  pointer local_58;
  pointer local_48;
  element_type *peStack_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  (*this->_vptr_Deserializer[2])(this,CONCAT62(in_register_00000032,field_id));
  local_68 = (pointer)0x0;
  pLStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  iVar1 = (*this->_vptr_Deserializer[8])(this);
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 != 0) {
    do {
      (*this->_vptr_Deserializer[6])(this);
      LogicalType::Deserialize((LogicalType *)&local_48,this);
      (*this->_vptr_Deserializer[7])(this);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
      emplace_back<duckdb::LogicalType>
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68,
                 (LogicalType *)&local_48);
      LogicalType::~LogicalType((LogicalType *)&local_48);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (*this->_vptr_Deserializer[9])(this);
  local_38._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_58;
  local_48 = (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
  peStack_40 = (element_type *)
               (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish;
  (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = local_68;
  (ret->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = pLStack_60;
  local_68 = (pointer)0x0;
  pLStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
  (*this->_vptr_Deserializer[3])(this);
  return;
}

Assistant:

inline void ReadProperty(const field_id_t field_id, const char *tag, T &ret) {
		OnPropertyBegin(field_id, tag);
		ret = Read<T>();
		OnPropertyEnd();
	}